

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationengine.cpp
# Opt level: O2

ResultValue * __thiscall
CalculationEngine::evaluate
          (ResultValue *__return_storage_ptr__,CalculationEngine *this,string *expressionString,
          Environment *environment)

{
  int64_t iVar1;
  undefined8 uVar2;
  ResultValueType RVar3;
  undefined4 uVar4;
  NumberType *numberType;
  EvaluationStack *pEVar5;
  runtime_error *this_00;
  _Elt_pointer pRVar6;
  pointer *__ptr;
  undefined1 local_158 [8];
  vector<Token,_std::allocator<Token>_> tokens;
  string local_120;
  Parser parser;
  CalculationVisitor calculationVisitor;
  
  Environment::setEvalMode(environment,this->mEvalMode);
  std::__cxx11::string::string((string *)&local_120,(string *)expressionString);
  numberType = currentNumberType(this);
  Tokenizer::tokenize(&tokens,&local_120,numberType);
  std::__cxx11::string::~string((string *)&local_120);
  Token::Token((Token *)&parser,END_OF_EXPRESSION);
  std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(&tokens,(Token *)&parser);
  Token::~Token((Token *)&parser);
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)&stack0xfffffffffffffec8,&tokens);
  Parser::Parser(&parser,(vector<Token,_std::allocator<Token>_> *)&stack0xfffffffffffffec8,this);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)&stack0xfffffffffffffec8);
  Parser::parse((Parser *)local_158);
  CalculationVisitor::CalculationVisitor(&calculationVisitor,this,environment);
  (**(code **)(*(long *)local_158 + 0x10))(local_158,&calculationVisitor,0);
  pEVar5 = CalculationVisitor::evaluationStack(&calculationVisitor);
  pRVar6 = (pEVar5->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pRVar6 != (pEVar5->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pRVar6 == (pEVar5->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pRVar6 = (pEVar5->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    *(undefined8 *)((__return_storage_ptr__->mComplexValue)._M_value + 8) =
         *(undefined8 *)(pRVar6[-1].mComplexValue._M_value + 8);
    RVar3 = pRVar6[-1].mType;
    uVar4 = *(undefined4 *)&pRVar6[-1].field_0x4;
    iVar1 = pRVar6[-1].mIntValue;
    uVar2 = *(undefined8 *)pRVar6[-1].mComplexValue._M_value;
    __return_storage_ptr__->mFloatValue = pRVar6[-1].mFloatValue;
    *(undefined8 *)(__return_storage_ptr__->mComplexValue)._M_value = uVar2;
    __return_storage_ptr__->mType = RVar3;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar4;
    __return_storage_ptr__->mIntValue = iVar1;
    CalculationVisitor::~CalculationVisitor(&calculationVisitor);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_158 + 8))();
    }
    Parser::~Parser(&parser);
    std::vector<Token,_std::allocator<Token>_>::~vector(&tokens);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Expected result.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ResultValue CalculationEngine::evaluate(const std::string& expressionString, Environment& environment) {
	environment.setEvalMode(mEvalMode);

	//Tokenize
	auto tokens = Tokenizer::tokenize(expressionString, currentNumberType());
	tokens.push_back(Token(TokenType::END_OF_EXPRESSION));

	//Parse
	Parser parser(tokens, *this);
	auto expression = parser.parse();

	//Evaluate
	CalculationVisitor calculationVisitor(*this, environment);
	expression->accept(calculationVisitor, nullptr);

	auto& evaluationStack = calculationVisitor.evaluationStack();
	if (evaluationStack.empty()) {
		throw std::runtime_error("Expected result.");
	}

	return evaluationStack.top();
}